

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O0

SAM_hdr_type * sam_hdr_find(SAM_hdr *hdr,char *type,char *ID_key,char *ID_value)

{
  SAM_hdr_type *pSVar1;
  khint_t kVar2;
  bool bVar3;
  SAM_hdr_type *local_78;
  SAM_hdr_type *local_70;
  SAM_hdr_type *local_68;
  char *local_60;
  char *cp2;
  char *cp1;
  SAM_hdr_tag *tag;
  khint_t k;
  int itype;
  SAM_hdr_type *t2;
  SAM_hdr_type *t1;
  char *ID_value_local;
  char *ID_key_local;
  char *type_local;
  SAM_hdr *hdr_local;
  
  if (ID_key != (char *)0x0) {
    if ((((*type == 'S') && (type[1] == 'Q')) && (*ID_key == 'S')) && (ID_key[1] == 'N')) {
      kVar2 = kh_get_m_s2i(hdr->ref_hash,ID_value);
      if (kVar2 == hdr->ref_hash->n_buckets) {
        local_68 = (SAM_hdr_type *)0x0;
      }
      else {
        local_68 = hdr->ref[hdr->ref_hash->vals[kVar2]].ty;
      }
      return local_68;
    }
    if (((*type == 'R') && (type[1] == 'G')) && ((*ID_key == 'I' && (ID_key[1] == 'D')))) {
      kVar2 = kh_get_m_s2i(hdr->rg_hash,ID_value);
      if (kVar2 == hdr->rg_hash->n_buckets) {
        local_70 = (SAM_hdr_type *)0x0;
      }
      else {
        local_70 = hdr->rg[hdr->rg_hash->vals[kVar2]].ty;
      }
      return local_70;
    }
    if (((*type == 'P') && (type[1] == 'G')) && ((*ID_key == 'I' && (ID_key[1] == 'D')))) {
      kVar2 = kh_get_m_s2i(hdr->pg_hash,ID_value);
      if (kVar2 == hdr->pg_hash->n_buckets) {
        local_78 = (SAM_hdr_type *)0x0;
      }
      else {
        local_78 = hdr->pg[hdr->pg_hash->vals[kVar2]].ty;
      }
      return local_78;
    }
  }
  kVar2 = kh_get_sam_hdr(hdr->h,(int)*type << 8 | (int)type[1]);
  if (kVar2 == hdr->h->n_buckets) {
    hdr_local = (SAM_hdr *)0x0;
  }
  else if (ID_key == (char *)0x0) {
    hdr_local = (SAM_hdr *)hdr->h->vals[kVar2];
  }
  else {
    pSVar1 = hdr->h->vals[kVar2];
    t2 = pSVar1;
    do {
      for (cp1 = (char *)t2->tag; cp1 != (char *)0x0; cp1 = *(char **)cp1) {
        if ((**(char **)(cp1 + 8) == *ID_key) && (*(char *)(*(long *)(cp1 + 8) + 1) == ID_key[1])) {
          cp2 = (char *)(*(long *)(cp1 + 8) + 3);
          local_60 = ID_value;
          while( true ) {
            bVar3 = false;
            if (*cp2 != '\0') {
              bVar3 = *cp2 == *local_60;
            }
            if (!bVar3) break;
            cp2 = cp2 + 1;
            local_60 = local_60 + 1;
          }
          if ((*local_60 == '\0') && (*cp2 == '\0')) {
            return t2;
          }
        }
      }
      t2 = t2->next;
    } while (t2 != pSVar1);
    hdr_local = (SAM_hdr *)0x0;
  }
  return (SAM_hdr_type *)hdr_local;
}

Assistant:

SAM_hdr_type *sam_hdr_find(SAM_hdr *hdr, char *type,
			   char *ID_key, char *ID_value) {
    SAM_hdr_type *t1, *t2;
    int itype = (type[0]<<8)|(type[1]);
    khint_t k;

    /* Special case for types we have prebuilt hashes on */
    if (ID_key) {
	if (type[0]   == 'S' && type[1]   == 'Q' &&
	    ID_key[0] == 'S' && ID_key[1] == 'N') {
	    k = kh_get(m_s2i, hdr->ref_hash, ID_value);
	    return k != kh_end(hdr->ref_hash)
		? hdr->ref[kh_val(hdr->ref_hash, k)].ty
		: NULL;
	}

	if (type[0]   == 'R' && type[1]   == 'G' &&
	    ID_key[0] == 'I' && ID_key[1] == 'D') {
	    k = kh_get(m_s2i, hdr->rg_hash, ID_value);
	    return k != kh_end(hdr->rg_hash)
		? hdr->rg[kh_val(hdr->rg_hash, k)].ty
		: NULL;
	}

	if (type[0]   == 'P' && type[1]   == 'G' &&
	    ID_key[0] == 'I' && ID_key[1] == 'D') {
	    k = kh_get(m_s2i, hdr->pg_hash, ID_value);
	    return k != kh_end(hdr->pg_hash)
		? hdr->pg[kh_val(hdr->pg_hash, k)].ty
		: NULL;
	}
    }

    k = kh_get(sam_hdr, hdr->h, itype);
    if (k == kh_end(hdr->h))
	return NULL;
    
    if (!ID_key)
	return kh_val(hdr->h, k);

    t1 = t2 = kh_val(hdr->h, k);
    do {
	SAM_hdr_tag *tag;
	for (tag = t1->tag; tag; tag = tag->next) {
	    if (tag->str[0] == ID_key[0] && tag->str[1] == ID_key[1]) {
		char *cp1 = tag->str+3;
		char *cp2 = ID_value;
		while (*cp1 && *cp1 == *cp2)
		    cp1++, cp2++;
		if (*cp2 || *cp1)
		    continue;
		return t1;
	    }
	}
	t1 = t1->next;
    } while (t1 != t2);

    return NULL;
}